

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureAlloc.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::FillTexPitchAndSize
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_GFX_SIZE_T WidthBytesPhysical,
          uint32_t Height,__GMM_BUFFER_TYPE *pBufferType)

{
  undefined1 auVar1 [16];
  uint8_t uVar2;
  int iVar3;
  GMM_PLATFORM_INFO *pGVar4;
  GMM_TEXTURE_CALC *pGVar5;
  WA_TABLE *pWVar6;
  SKU_FEATURE_TABLE *pSVar7;
  bool bVar8;
  bool bVar9;
  undefined4 local_a8;
  ulong local_a0;
  ulong local_98;
  uint64_t TotalAlignment;
  int64_t SurfaceMaxSize;
  uint32_t BufferSizePadding;
  uint32_t BufferSizeAlignment;
  uint64_t SliceSize;
  int64_t Size;
  uint8_t IsYCrCbSurface;
  uint8_t IsYUVSurface;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_GFX_SIZE_T WidthBytesLock;
  GMM_GFX_SIZE_T WidthBytesRender;
  __GMM_BUFFER_TYPE *p_Stack_38;
  GMM_STATUS Status;
  __GMM_BUFFER_TYPE *pBufferType_local;
  GMM_PLATFORM_INFO *pGStack_28;
  uint32_t Height_local;
  GMM_GFX_SIZE_T WidthBytesPhysical_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  WidthBytesRender._4_4_ = GMM_SUCCESS;
  WidthBytesLock = 0;
  pPlatform = (GMM_PLATFORM_INFO *)0x0;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (pBufferType == (__GMM_BUFFER_TYPE *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    p_Stack_38 = pBufferType;
    pBufferType_local._4_4_ = Height;
    pGStack_28 = (GMM_PLATFORM_INFO *)WidthBytesPhysical;
    WidthBytesPhysical_local = (GMM_GFX_SIZE_T)pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    pGVar4 = GmmGetPlatformInfo(this->pGmmLibContext);
    if ((ulong)p_Stack_38->MinPitch < pGStack_28) {
      local_98 = (ulong)pGStack_28;
    }
    else {
      local_98 = (ulong)p_Stack_38->MinPitch;
    }
    if (*(int *)(WidthBytesPhysical_local + 0x1b0) < 0x6d) {
      if (pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalSize == 0) {
        *(uint *)(WidthBytesPhysical_local + 0x1b8) =
             *(uint *)(WidthBytesPhysical_local + 0x1b8) | 0x10;
        pPlatform = (GMM_PLATFORM_INFO *)
                    ((local_98 + (p_Stack_38->PitchAlignment - 1)) -
                    (local_98 + (p_Stack_38->PitchAlignment - 1) &
                    (ulong)(p_Stack_38->PitchAlignment - 1)));
        WidthBytesLock = (GMM_GFX_SIZE_T)pPlatform;
        pGStack_28 = pPlatform;
      }
      else {
        if ((((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x24 & 1) == 0) &&
            ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x25 & 1) == 0)) &&
           ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x26 & 1) == 0)) {
          if (((uint)((ulong)*(undefined8 *)(WidthBytesPhysical_local + 0x14) >> 0x23) & 1) == 1) {
            *(uint *)(WidthBytesPhysical_local + 0x1b8) =
                 *(uint *)(WidthBytesPhysical_local + 0x1b8) | 4;
          }
          else if (((uint)((ulong)*(undefined8 *)(WidthBytesPhysical_local + 0x14) >> 0x22) & 1) ==
                   1) {
            *(uint *)(WidthBytesPhysical_local + 0x1b8) =
                 *(uint *)(WidthBytesPhysical_local + 0x1b8) | 2;
          }
        }
        else {
          *(uint *)(WidthBytesPhysical_local + 0x1b8) =
               *(uint *)(WidthBytesPhysical_local + 0x1b8) | 8;
        }
        pBufferType_local._4_4_ =
             (pBufferType_local._4_4_ +
             (pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileHeight - 1))
             - (pBufferType_local._4_4_ +
                (pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileHeight - 1
                ) & pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileHeight
                    - 1);
        pGStack_28 = (GMM_PLATFORM_INFO *)
                     ((local_98 +
                      (pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                       LogicalTileWidth - 1)) -
                     (local_98 +
                      (pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                       LogicalTileWidth - 1) &
                     (ulong)(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                             LogicalTileWidth - 1)));
        if ((((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x1d & 1) != 0) ||
            ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x14 & 1) != 0)) &&
           (((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x26 & 1) == 0 &&
            (((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x2c & 1) == 0 &&
             (pSVar7 = Context::GetSkuTable(this->pGmmLibContext),
             ((ulong)pSVar7->field_1 >> 0x19 & 1) == 0)))))) {
          pGStack_28 = (GMM_PLATFORM_INFO *)
                       ((long)pGStack_28 +
                       ((ulong)(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                                LogicalTileWidth * 4 - 1) -
                       ((long)&(pGStack_28->Platform).eProductFamily +
                        (ulong)(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                                LogicalTileWidth * 4 - 1) &
                       (ulong)(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                               LogicalTileWidth * 4 - 1))));
        }
        pPlatform = pGStack_28;
        WidthBytesLock =
             (long)pGStack_28 +
             ((ulong)(p_Stack_38->RenderPitchAlignment - 1) -
             ((long)&(pGStack_28->Platform).eProductFamily +
              (ulong)(p_Stack_38->RenderPitchAlignment - 1) &
             (ulong)(p_Stack_38->RenderPitchAlignment - 1)));
        pGVar5 = Context::GetTextureCalc(this->pGmmLibContext);
        (*pGVar5->_vptr_GmmTextureCalc[0x1e])
                  (pGVar5,WidthBytesPhysical_local,&WidthBytesLock,&stack0xffffffffffffffd8,
                   &pPlatform);
        if (p_Stack_38->NeedPow2LockAlignment != '\0') {
          pPlatform = (GMM_PLATFORM_INFO *)GFX_POW2_SIZE((int64_t)pGStack_28);
        }
        pPlatform = (GMM_PLATFORM_INFO *)
                    ((long)pPlatform +
                    ((ulong)(p_Stack_38->LockPitchAlignment - 1) -
                    ((long)&(pPlatform->Platform).eProductFamily +
                     (ulong)(p_Stack_38->LockPitchAlignment - 1) &
                    (ulong)(p_Stack_38->LockPitchAlignment - 1))));
        if ((*(int *)WidthBytesPhysical_local == 8) ||
           ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 7 & 1) != 0)) {
          pGStack_28 = (GMM_PLATFORM_INFO *)WidthBytesLock;
        }
        pWVar6 = Context::GetWaTable(this->pGmmLibContext);
        if (((((*(ulong *)&pWVar6->field_0x4 >> 0x19 & 1) != 0) &&
             (*(int *)(WidthBytesPhysical_local + 0x44) == 8)) &&
            (((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x24 & 1) != 0 ||
             ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x2b & 1) != 0)))) &&
           ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 6 & 1) != 0)) {
          pPlatform = (GMM_PLATFORM_INFO *)
                      ((long)pPlatform +
                      (0xff - ((ulong)((long)&(pPlatform->Constant).MaxPitch + 7U) & 0xff)));
          WidthBytesLock = (GMM_GFX_SIZE_T)pPlatform;
          pGStack_28 = pPlatform;
        }
      }
      *(GMM_PLATFORM_INFO **)(WidthBytesPhysical_local + 0xf0) = pPlatform;
      if (((*(ulong *)(WidthBytesPhysical_local + 0x14) & 1) != 0) &&
         (*(long *)(WidthBytesPhysical_local + 0xf8) != 0)) {
        *(undefined8 *)(WidthBytesPhysical_local + 0xf0) =
             *(undefined8 *)(WidthBytesPhysical_local + 0xf8);
      }
      pWVar6 = Context::GetWaTable(this->pGmmLibContext);
      if ((((*(ulong *)&pWVar6->field_0x4 >> 0x26 & 1) != 0) &&
          ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x25 & 1) != 0)) &&
         (0xf00 < *(ulong *)(WidthBytesPhysical_local + 0x20))) {
        *(ulong *)(WidthBytesPhysical_local + 0xf0) =
             (*(long *)(WidthBytesPhysical_local + 0xf0) +
             (ulong)(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileWidth
                     * 4 - 1)) -
             (*(long *)(WidthBytesPhysical_local + 0xf0) +
              (ulong)(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileWidth
                      * 4 - 1) &
             (ulong)(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileWidth
                     * 4 - 1));
      }
      pSVar7 = Context::GetSkuTable(this->pGmmLibContext);
      if (((((uint)pSVar7->field_3 & 1) != 0) &&
          (pWVar6 = Context::GetWaTable(this->pGmmLibContext),
          (*(ulong *)&pWVar6->field_0x4 >> 0x28 & 1) != 0)) &&
         (((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 7 & 1) != 0 &&
          (((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x13 & 1) != 0 &&
           ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x28 & 1) == 0)))))) {
        if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 8 & 1) == 0) {
          *(ulong *)(WidthBytesPhysical_local + 0xf0) =
               (*(long *)(WidthBytesPhysical_local + 0xf0) + 0x1ff) -
               (*(long *)(WidthBytesPhysical_local + 0xf0) + 0x1ffU & 0x1ff);
        }
        else {
          *(ulong *)(WidthBytesPhysical_local + 0xc) =
               *(ulong *)(WidthBytesPhysical_local + 0xc) & 0xffffffffffffff7f |
               (ulong)((*(ulong *)(WidthBytesPhysical_local + 0xf0) & 0x1ff) == 0) << 7;
        }
      }
      if (((((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 1 & 1) != 0) &&
           ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x29 & 1) != 0)) &&
          ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 7 & 1) != 0)) &&
         (0xb < (int)(pGVar4->Platform).eRenderCoreFamily)) {
        if (*(ulong *)(WidthBytesPhysical_local + 0xf0) <
            (ulong)(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileWidth
                   << 3)) {
          local_a0 = *(ulong *)(WidthBytesPhysical_local + 0xf0);
        }
        else {
          local_a0 = (ulong)(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                             LogicalTileWidth << 3);
        }
        *(ulong *)(WidthBytesPhysical_local + 0xf0) = local_a0;
      }
      if ((((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 1 & 1) != 0) &&
          ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x29 & 1) != 0)) &&
         ((ulong)((pGVar4->TexAlign).CCS.MaxPitchinTiles *
                 pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileWidth) <
          *(ulong *)(WidthBytesPhysical_local + 0xf0))) {
        WidthBytesRender._4_4_ = GMM_ERROR;
      }
      pWVar6 = Context::GetWaTable(this->pGmmLibContext);
      if ((*(ulong *)&pWVar6->field_0x4 >> 0x36 & 1) != 0) {
        uVar2 = GmmIsPlanar(*(GMM_RESOURCE_FORMAT *)(WidthBytesPhysical_local + 4));
        if (((uVar2 == '\0') || (*(int *)(WidthBytesPhysical_local + 4) == 0x13c)) ||
           (bVar8 = true, *(int *)(WidthBytesPhysical_local + 4) == 0x168)) {
          uVar2 = GmmIsYUVPacked(*(GMM_RESOURCE_FORMAT *)(WidthBytesPhysical_local + 4));
          bVar8 = false;
          if (uVar2 != '\0') {
            bVar8 = true;
            if ((*(int *)(WidthBytesPhysical_local + 4) != 0x179) &&
               (bVar8 = true, *(int *)(WidthBytesPhysical_local + 4) != 0x176)) {
              bVar8 = *(int *)(WidthBytesPhysical_local + 4) == 0x176;
            }
            bVar8 = (bool)(bVar8 ^ 1);
          }
        }
        bVar9 = true;
        if (((*(int *)(WidthBytesPhysical_local + 4) != 0xde) &&
            (bVar9 = true, *(int *)(WidthBytesPhysical_local + 4) != 0xdf)) &&
           (bVar9 = true, *(int *)(WidthBytesPhysical_local + 4) != 0xe0)) {
          bVar9 = *(int *)(WidthBytesPhysical_local + 4) == 0xe1;
        }
        if ((((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x2b & 1) != 0) &&
            ((bVar8 || (bVar9)))) &&
           (auVar1._8_8_ = 0, auVar1._0_8_ = *(ulong *)(WidthBytesPhysical_local + 0xf0),
           (auVar1 / ZEXT416(pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                             LogicalTileWidth) & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
          *(ulong *)(WidthBytesPhysical_local + 0xf0) =
               *(long *)(WidthBytesPhysical_local + 0xf0) +
               (ulong)pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileWidth
          ;
        }
      }
      pWVar6 = Context::GetWaTable(this->pGmmLibContext);
      if ((((*(ulong *)&pWVar6->field_0x4 >> 0x27 & 1) != 0) &&
          ((*(int *)(WidthBytesPhysical_local + 4) == 0x15d ||
           (uVar2 = GmmIsP0xx(*(GMM_RESOURCE_FORMAT *)(WidthBytesPhysical_local + 4)), uVar2 != '\0'
           )))) && (((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x13 & 1) != 0 &&
                    (((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x28 & 1) == 0 &&
                     ((*(int *)WidthBytesPhysical_local == 8 ||
                      ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 7 & 1) != 0)))))))) {
        if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 8 & 1) == 0) {
          *(ulong *)(WidthBytesPhysical_local + 0xf0) =
               (*(long *)(WidthBytesPhysical_local + 0xf0) + 0xfff) -
               (*(long *)(WidthBytesPhysical_local + 0xf0) + 0xfffU & 0xfff);
        }
        else {
          *(ulong *)(WidthBytesPhysical_local + 0xc) =
               *(ulong *)(WidthBytesPhysical_local + 0xc) & 0xffffffffffffff7f |
               (ulong)((*(ulong *)(WidthBytesPhysical_local + 0xf0) & 0xfff) == 0) << 7;
        }
      }
      if (0x4f7 < (int)(pGVar4->Platform).eProductFamily) {
        *(undefined8 *)(WidthBytesPhysical_local + 0x1a0) =
             *(undefined8 *)(WidthBytesPhysical_local + 0xf0);
      }
      if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x18 & 1) == 0) {
        SliceSize = *(long *)(WidthBytesPhysical_local + 0xf0) * (ulong)pBufferType_local._4_4_;
        if ((*(int *)WidthBytesPhysical_local == 3) &&
           ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x13 & 1) == 0)) {
          SliceSize = pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileDepth
                      * SliceSize;
        }
        if (((((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x25 & 1) != 0) ||
             ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x26 & 1) != 0)) ||
            ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x2c & 1) != 0)) &&
           (((1 < *(uint *)(WidthBytesPhysical_local + 0x44) &&
             ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 6 & 1) == 0)) &&
            ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x1d & 1) == 0)))) {
          pSVar7 = Context::GetSkuTable(this->pGmmLibContext);
          if ((*(ushort *)&pSVar7->field_0 >> 6 & 1) == 0) {
            pSVar7 = Context::GetSkuTable(this->pGmmLibContext);
            if ((((ulong)pSVar7->field_1 >> 0x23 & 1) == 0) &&
               ((*(int *)(WidthBytesPhysical_local + 0x44) == 8 ||
                (*(int *)(WidthBytesPhysical_local + 0x44) == 0x10)))) {
              SliceSize = *(long *)(WidthBytesPhysical_local + 0xf0) *
                          (ulong)pBufferType_local._4_4_ * 4;
            }
            else {
              SliceSize = *(uint *)(WidthBytesPhysical_local + 0x44) * SliceSize;
            }
          }
          else {
            SliceSize = *(uint *)(WidthBytesPhysical_local + 0x44) * SliceSize;
          }
        }
        if (((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x24 & 1) != 0) &&
           ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x23 & 1) != 0)) {
          SliceSize = (SliceSize + 0xffff) - (SliceSize + 0xffff & 0xffff);
        }
        pSVar7 = Context::GetSkuTable(this->pGmmLibContext);
        if ((((ulong)pSVar7->field_1 >> 0x22 & 1) != 0) &&
           ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x13 & 1) != 0)) {
          SliceSize = (SliceSize + 0xff) - (SliceSize + 0xff & 0xff);
        }
        if ((((((*(int *)WidthBytesPhysical_local == 6) &&
               (pWVar6 = Context::GetWaTable(this->pGmmLibContext),
               (*(ulong *)&pWVar6->field_0x4 >> 0x12 & 1) != 0)) &&
              ((*(ushort *)(WidthBytesPhysical_local + 0x1c) >> 3 & 1) == 0)) &&
             (((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 5 & 1) == 0 &&
              ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x16 & 1) == 0)))) &&
            ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 9 & 1) == 0)) &&
           (((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x1e & 1) == 0 &&
            ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x1f & 1) == 0)))) {
          iVar3 = 0x1000;
          if (10 < (int)(pGVar4->Platform).eRenderCoreFamily) {
            iVar3 = 0x2000;
          }
          SliceSize = ((SliceSize + (iVar3 - 1)) - (SliceSize + (iVar3 - 1) & (ulong)(iVar3 - 1))) +
                      0x10;
        }
        if (((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 10 & 1) != 0) &&
           ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0xc & 1) != 0)) {
          SliceSize = SliceSize + 8;
        }
        if ((((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 5 & 1) == 0) ||
            (*(char *)(WidthBytesPhysical_local + 0x200) != '\0')) ||
           (*(char *)(WidthBytesPhysical_local + 0x201) != '\0')) {
          SliceSize = (SliceSize + 0xfff) - (SliceSize + 0xfff & 0xfff);
        }
      }
      else {
        pSVar7 = Context::GetSkuTable(this->pGmmLibContext);
        if ((*(byte *)&pSVar7->field_5 >> 1 & 1) == 0) {
          if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x19 & 1) == 0) {
            *(int *)(WidthBytesPhysical_local + 0x1c8) =
                 (int)*(undefined8 *)(WidthBytesPhysical_local + 0xf0) *
                 *(int *)(WidthBytesPhysical_local + 0x28);
            *(int *)(WidthBytesPhysical_local + 0x1c4) =
                 (int)*(undefined8 *)(WidthBytesPhysical_local + 0xf0) *
                 (*(int *)(WidthBytesPhysical_local + 0x1bc) +
                 *(int *)(WidthBytesPhysical_local + 0x1c0));
            if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x13 & 1) == 0) {
              if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 7 & 1) != 0) {
                *(int *)(WidthBytesPhysical_local + 0x1cc) =
                     *(int *)(WidthBytesPhysical_local + 0x28) * 2 +
                     *(int *)(WidthBytesPhysical_local + 0x1c0);
              }
            }
            else {
              pBufferType_local._4_4_ =
                   *(int *)(WidthBytesPhysical_local + 0x28) +
                   *(int *)(WidthBytesPhysical_local + 0x1c0) +
                   *(int *)(WidthBytesPhysical_local + 0x1bc);
              *(uint32_t *)(WidthBytesPhysical_local + 0x1cc) = pBufferType_local._4_4_;
            }
          }
          else {
            *(int *)(WidthBytesPhysical_local + 0x1c8) =
                 (int)*(undefined8 *)(WidthBytesPhysical_local + 0xf0) *
                 *(int *)(WidthBytesPhysical_local + 0x28);
            *(int *)(WidthBytesPhysical_local + 0x1c4) =
                 (int)*(undefined8 *)(WidthBytesPhysical_local + 0xf0) *
                 (*(int *)(WidthBytesPhysical_local + 0x1bc) +
                 *(int *)(WidthBytesPhysical_local + 0x1c0));
            pBufferType_local._4_4_ =
                 (*(int *)(WidthBytesPhysical_local + 0x28) * 2 +
                  *(int *)(WidthBytesPhysical_local + 0x1c0) +
                 (pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].LogicalTileHeight -
                 1)) - (*(int *)(WidthBytesPhysical_local + 0x28) * 2 +
                        *(int *)(WidthBytesPhysical_local + 0x1c0) +
                        (pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                         LogicalTileHeight - 1) &
                       pGVar4->TileInfo[*(uint *)(WidthBytesPhysical_local + 0x1b0)].
                       LogicalTileHeight - 1);
            *(uint32_t *)(WidthBytesPhysical_local + 0x1cc) = pBufferType_local._4_4_;
          }
        }
        else {
          *(undefined4 *)(WidthBytesPhysical_local + 0x1c8) = 0;
          if (((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x19 & 1) == 0) ||
             (*(int *)(WidthBytesPhysical_local + 0x34) != 2)) {
            if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x13 & 1) == 0) {
              if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 7 & 1) != 0) {
                *(undefined4 *)(WidthBytesPhysical_local + 0x1c4) = 0;
                *(uint32_t *)(WidthBytesPhysical_local + 0x1cc) = pBufferType_local._4_4_;
              }
            }
            else {
              *(uint32_t *)(WidthBytesPhysical_local + 0x1c4) =
                   (int)*(undefined8 *)(WidthBytesPhysical_local + 0xf0) * pBufferType_local._4_4_;
              pBufferType_local._4_4_ = pBufferType_local._4_4_ << 1;
              *(uint32_t *)(WidthBytesPhysical_local + 0x1cc) = pBufferType_local._4_4_;
            }
          }
          else {
            *(int *)(WidthBytesPhysical_local + 0x1c4) =
                 (int)*(undefined8 *)(WidthBytesPhysical_local + 0xf0) *
                 *(int *)(WidthBytesPhysical_local + 0x6c);
            *(uint32_t *)(WidthBytesPhysical_local + 0x1cc) = pBufferType_local._4_4_;
          }
        }
        SliceSize = *(long *)(WidthBytesPhysical_local + 0xf0) * (ulong)pBufferType_local._4_4_;
        *(int *)(WidthBytesPhysical_local + 0x1d0) =
             (int)*(undefined8 *)(WidthBytesPhysical_local + 0xf0) *
             *(int *)(WidthBytesPhysical_local + 0x1cc);
      }
      if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x12 & 1) == 0) {
        if ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x23 & 1) == 0) {
          TotalAlignment = pGVar4->SurfaceMaxSize;
        }
        else {
          TotalAlignment = 0x10000000000;
        }
      }
      else {
        TotalAlignment = (pGVar4->NoRestriction).MaxWidth;
      }
      if ((long)TotalAlignment < (long)SliceSize) {
        WidthBytesRender._4_4_ = GMM_ERROR;
      }
      else {
        *(uint64_t *)(WidthBytesPhysical_local + 0x100) = SliceSize;
      }
      if ((*(int *)(WidthBytesPhysical_local + 0x4c) == 0) ||
         (p_Stack_38->Alignment % *(uint *)(WidthBytesPhysical_local + 0x4c) == 0)) {
        *(uint32_t *)(WidthBytesPhysical_local + 0x4c) = p_Stack_38->Alignment;
      }
      else if (*(uint *)(WidthBytesPhysical_local + 0x4c) % p_Stack_38->Alignment != 0) {
        if ((ulong)*(uint *)(WidthBytesPhysical_local + 0x4c) * (ulong)p_Stack_38->Alignment <
            0x100000000) {
          *(uint32_t *)(WidthBytesPhysical_local + 0x4c) =
               *(int *)(WidthBytesPhysical_local + 0x4c) * p_Stack_38->Alignment;
        }
        else {
          WidthBytesRender._4_4_ = GMM_ERROR;
        }
      }
      if (((((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x24 & 1) != 0) &&
           (0xb < (int)(pGVar4->Platform).eRenderCoreFamily)) ||
          ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x1b & 1) != 0)) ||
         (((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x26 & 1) != 0 ||
          ((*(ulong *)(WidthBytesPhysical_local + 0x14) >> 0x2c & 1) != 0)))) {
        if ((*(uint *)(WidthBytesPhysical_local + 0x4c) & 0xffff) == 0) {
          local_a8 = *(undefined4 *)(WidthBytesPhysical_local + 0x4c);
        }
        else {
          local_a8 = 0x10000;
        }
        *(undefined4 *)(WidthBytesPhysical_local + 0x4c) = local_a8;
      }
      pWVar6 = Context::GetWaTable(this->pGmmLibContext);
      if (((*(ulong *)&pWVar6->field_0x4 >> 0x2a & 1) != 0) &&
         ((*(ulong *)(WidthBytesPhysical_local + 0xc) >> 0x10 & 1) != 0)) {
        *(undefined4 *)(WidthBytesPhysical_local + 0x4c) = 0x400000;
      }
      this_local._4_4_ = WidthBytesRender._4_4_;
    }
    else {
      this_local._4_4_ = GMM_ERROR;
    }
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::FillTexPitchAndSize(GMM_TEXTURE_INFO * pTexInfo,
                                                       GMM_GFX_SIZE_T     WidthBytesPhysical,
                                                       uint32_t           Height,
                                                       __GMM_BUFFER_TYPE *pBufferType)
{
    GMM_STATUS     Status           = GMM_SUCCESS;
    GMM_GFX_SIZE_T WidthBytesRender = 0;
    GMM_GFX_SIZE_T WidthBytesLock   = 0;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pBufferType, GMM_ERROR);

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // Make sure that we meet the minimum HW requirment for that buffer type
    WidthBytesPhysical = GFX_MAX(WidthBytesPhysical, pBufferType->MinPitch);

    if(pTexInfo->TileMode >= GMM_TILE_MODES)
    {
        GMM_ASSERTDPF(0, "Invalid parameter!");
        return GMM_ERROR;
    }

    if(GMM_ISNOT_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        pTexInfo->LegacyFlags |= GMM_LINEAR;

        // For linear surace we need to make sure that physical pitch
        // meet the HW alignment (i.e DWORD or QWORD, ETC)
        WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                       pBufferType->PitchAlignment);

        WidthBytesRender = WidthBytesPhysical;
        WidthBytesLock   = WidthBytesPhysical;
    }
    else
    {
        if(pTexInfo->Flags.Info.TiledY ||
           pTexInfo->Flags.Info.TiledYf ||
           pTexInfo->Flags.Info.TiledYs)
        {
            pTexInfo->LegacyFlags |= GMM_TILE_Y;
        }
        else if(pTexInfo->Flags.Info.TiledX == 1)
        {
            pTexInfo->LegacyFlags |= GMM_TILE_X;
        }
        else if(pTexInfo->Flags.Info.TiledW == 1)
        {
            pTexInfo->LegacyFlags |= GMM_TILE_W;
        }

        // Align Height to tile height boundary
        Height = GFX_ALIGN(Height, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);

        // Align Width to next tile boundary
        WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                       pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);

        if(pTexInfo->Flags.Info.RenderCompressed || pTexInfo->Flags.Info.MediaCompressed)
        {
            if(!GMM_IS_64KB_TILE(pTexInfo->Flags) && !pGmmLibContext->GetSkuTable().FtrFlatPhysCCS) //Ys is naturally aligned to required 4 YF pages
            {
                // Align Pitch to 4-tile boundary
                WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                               4 * pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
            }
        }

        // Calculate Alignment Restriction for rendering on the surface
        // NOTE:
        //  WidthBytesPhysical == true physical pitch used to determine amount
        //                        of Pages need for a surface
        //  WidthBytesRender == HW require pitch of a surface for rendering
        //                      (i.e. power2
        //  WidthBytesLock == Pitch when a surface is visible via Fence region.

        WidthBytesRender = WidthBytesLock = WidthBytesPhysical;

        // Align pitch to meet our HW requirment for each buffer
        WidthBytesRender = GFX_ALIGN(WidthBytesRender,
                                     pBufferType->RenderPitchAlignment);

        // Media Memory Compression : Allocate one memory tile wider than is required...
        pGmmLibContext->GetTextureCalc()->AllocateOneTileThanRequied(pTexInfo, WidthBytesRender,
                                                                        WidthBytesPhysical, WidthBytesLock);

        // check if locking a particular suface need to be power 2 or not
        if(pBufferType->NeedPow2LockAlignment)
        {
            WidthBytesLock = GFX_POW2_SIZE(WidthBytesPhysical);
        }

        // Align pitch to meet our HW requirment for each buffer
        // [1] 8K lock pitch is needed on Gen3 when we internally remap the
        //     display surface in GmmGetDisplayStartAddress ( ). Gen4,
        //     we don't remap due to Persurface tiling and stick to 64byte
        //     lock pitch alignment.
        WidthBytesLock = GFX_ALIGN(WidthBytesLock,
                                   pBufferType->LockPitchAlignment);

        if((pTexInfo->Type == RESOURCE_PRIMARY) || pTexInfo->Flags.Gpu.FlipChain)
        {
            // [2] At creation time, we tell OS the Render size, not
            //     SurfaceSizePhysical like other surfaces. Therefore, we change
            //     the SurfaceSizePhysical to match render size for simplicity.
            WidthBytesPhysical = WidthBytesRender;
        }

        if(pGmmLibContext->GetWaTable().WaMsaa8xTileYDepthPitchAlignment &&
           (pTexInfo->MSAA.NumSamples == 8) &&
           GMM_IS_4KB_TILE(pTexInfo->Flags) &&
           pTexInfo->Flags.Gpu.Depth)
        {
            WidthBytesLock =
            WidthBytesRender =
            WidthBytesPhysical = GFX_ALIGN(WidthBytesLock, GMM_BYTES(256));
        }
    }

    __GMM_ASSERT(WidthBytesLock == WidthBytesPhysical &&
                 WidthBytesRender == WidthBytesPhysical &&
                 WidthBytesLock == WidthBytesRender);
    pTexInfo->Pitch = WidthBytesLock;

    //VirtualPadding override
    if(pTexInfo->Flags.Info.AllowVirtualPadding &&
       pTexInfo->OverridePitch)
    {
        pTexInfo->Pitch = pTexInfo->OverridePitch;
    }

    // When lossless compression is enabled with plane width greater than 3840 and
    // horizontal panning, the surface pitch should be a multiple of 4 tiles. Since
    // GMM doesn't know about lossless compression status at allocation time, here
    // we apply the WA to all unified aux surfaces.
    if(pGmmLibContext->GetWaTable().WaLosslessCompressionSurfaceStride &&
       pTexInfo->Flags.Gpu.UnifiedAuxSurface &&
       (pTexInfo->BaseWidth > 3840))
    {
        pTexInfo->Pitch = GFX_ALIGN(pTexInfo->Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * 4);
    }

    // If FBC is enabled with a linear surface, the surface pitch should be a multiple of
    // 8 cache lines (512 bytes). Since GMM doesn't know about FBC status, here we apply
    // the WA to all linear surfaces.
    // Xadapter surfaces has to be 128 Bytes aligned and hence we don't want this 512B alignment
    // for Xadapter. Eventually FBC will be disabled in case of Xadapter Linear surfaces
    if(pGmmLibContext->GetSkuTable().FtrFbc &&
       pGmmLibContext->GetWaTable().WaFbcLinearSurfaceStride &&
       pTexInfo->Flags.Gpu.FlipChain &&
       pTexInfo->Flags.Info.Linear &&
       !pTexInfo->Flags.Info.XAdapter)
    {
        if(pTexInfo->Flags.Gpu.FlipChainPreferred)
        {
            // Moderate down displayable flags if input parameters (.FlipChainPrefered)
            // deprioritise it, over Pitch alignement in this case.
            pTexInfo->Flags.Gpu.FlipChain = __GMM_IS_ALIGN(pTexInfo->Pitch, 512);
        }
        else
        {
            pTexInfo->Pitch = GFX_ALIGN(pTexInfo->Pitch, 512);
        }
    }

    // For CCS Aux Display Surf the surface stride should not exceed 8 times the LogicalTileWidth.
    if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs && pTexInfo->Flags.Gpu.FlipChain &&
       (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE))
    {
        __GMM_ASSERT(pTexInfo->Pitch <= (pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * 8));
        pTexInfo->Pitch = GFX_MIN(pTexInfo->Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * 8);
    }

    if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs &&
       (pTexInfo->Pitch > pPlatform->TexAlign.CCS.MaxPitchinTiles * pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth))
    {
        GMM_ASSERTDPF(0, "Aux Surface pitch too large!");
        Status = GMM_ERROR;
    }
    
    if(pGmmLibContext->GetWaTable().Wa_15010089951)
    {
        // Default Tiling is set to Tile64 on FtrTileY disabled platforms
        uint8_t IsYUVSurface = ((GmmIsPlanar(pTexInfo->Format) &&
                                 (!((pTexInfo->Format == GMM_FORMAT_BGRP) || (pTexInfo->Format == GMM_FORMAT_RGBP)))) ||
                                (GmmIsYUVPacked(pTexInfo->Format) &&
                                 !((pTexInfo->Format == GMM_FORMAT_YVYU_2x1) || (pTexInfo->Format == GMM_FORMAT_UYVY_2x1) || (pTexInfo->Format == GMM_FORMAT_UYVY_2x1))));

        //YCRCB* formats
        uint8_t IsYCrCbSurface = ((pTexInfo->Format == GMM_FORMAT_YCRCB_NORMAL) ||
                                  (pTexInfo->Format == GMM_FORMAT_YCRCB_SWAPUV) ||
                                  (pTexInfo->Format == GMM_FORMAT_YCRCB_SWAPUVY) || (pTexInfo->Format == GMM_FORMAT_YCRCB_SWAPY));

        // Allocation needs to extend an extra tile in width when pitch is not an odd multiplication
        // of tile width which is 128 for Tile4 (YUV allocation is forced as Tile4).
        if(pTexInfo->Flags.Info.Tile4 && (IsYUVSurface || IsYCrCbSurface) &&
           ((pTexInfo->Pitch / (pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth)) % 2 == 0))
        {
            pTexInfo->Pitch = (pTexInfo->Pitch + (pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth));
        }
    }

    // For NV12 Linear FlipChain surfaces, UV plane distance should be 4k Aligned.
    // Hence make the stride to align to 4k, so that UV distance will be 4k aligned.
    if(pGmmLibContext->GetWaTable().Wa4kAlignUVOffsetNV12LinearSurface &&
       (pTexInfo->Format == GMM_FORMAT_NV12 || GmmIsP0xx(pTexInfo->Format)) && pTexInfo->Flags.Info.Linear &&
       (!pTexInfo->Flags.Info.XAdapter) &&
       ((pTexInfo->Type == RESOURCE_PRIMARY) || pTexInfo->Flags.Gpu.FlipChain))
    {
        if(pTexInfo->Flags.Gpu.FlipChainPreferred)
        {
            // Moderate down displayable flags if input parameters (.FlipChainPrefered)
            // deprioritise it, over Pitch alignement in this case.
            pTexInfo->Flags.Gpu.FlipChain = __GMM_IS_ALIGN(pTexInfo->Pitch, GMM_KBYTE(4));
        }
        else
        {
            pTexInfo->Pitch = GFX_ALIGN(pTexInfo->Pitch, GMM_KBYTE(4));
        }
    }

    if((GFX_GET_CURRENT_PRODUCT(pPlatform->Platform) >= IGFX_METEORLAKE))
    {
        pTexInfo->OffsetInfo.PlaneXe_LPG.PhysicalPitch = pTexInfo->Pitch;
    }

    { // Surface Sizes
        int64_t Size;

        if(pTexInfo->Flags.Gpu.S3d)
        {
            if(pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d) // BDW+ Display Engine S3D (Tiled)
            {
                __GMM_ASSERT(!pTexInfo->Flags.Info.Linear);

                pTexInfo->S3d.BlankAreaOffset = 0;

                if(pTexInfo->Flags.Gpu.S3dDx && (pTexInfo->ArraySize == 2))
                {
                    pTexInfo->S3d.RFrameOffset     = GFX_ULONG_CAST(pTexInfo->Pitch * pTexInfo->Alignment.QPitch);
                    pTexInfo->S3d.TallBufferHeight = Height;
                }
                else
                {
                    if(pTexInfo->Flags.Gpu.Overlay)
                    {
                        pTexInfo->S3d.RFrameOffset = GFX_ULONG_CAST(pTexInfo->Pitch * Height);

                        Height = pTexInfo->S3d.TallBufferHeight = Height * 2;
                    }
                    else if(pTexInfo->Flags.Gpu.FlipChain)
                    {
                        pTexInfo->S3d.RFrameOffset     = 0;
                        pTexInfo->S3d.TallBufferHeight = Height;
                    }
                    else
                    {
                        // Something must be wrong. Not an S3D resource!
                        __GMM_ASSERT(0);
                    }
                }

                __GMM_ASSERT(__GMM_IS_ALIGN(pTexInfo->S3d.RFrameOffset, PAGE_SIZE));
            }
            else if(pTexInfo->Flags.Gpu.S3dDx) // DX S3D (Tiled)
            {
                __GMM_ASSERT(!pTexInfo->Flags.Info.Linear || !pTexInfo->Flags.Gpu.Overlay);
                __GMM_ASSERT(pTexInfo->ArraySize <= 1); // S3D framebuffer arrays are not supported (pre-BDW).

                pTexInfo->S3d.BlankAreaOffset = GFX_ULONG_CAST(pTexInfo->Pitch * pTexInfo->BaseHeight);

                pTexInfo->S3d.RFrameOffset =
                GFX_ULONG_CAST(pTexInfo->Pitch *
                               (pTexInfo->S3d.DisplayModeHeight + pTexInfo->S3d.NumBlankActiveLines));

                Height =
                pTexInfo->S3d.TallBufferHeight =
                GFX_ALIGN(
                (pTexInfo->BaseHeight * 2) + pTexInfo->S3d.NumBlankActiveLines,
                pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
            }
            else // Legacy S3D
            {
                __GMM_ASSERT(pTexInfo->Flags.Info.Linear);

                pTexInfo->S3d.BlankAreaOffset = GFX_ULONG_CAST(pTexInfo->Pitch * pTexInfo->BaseHeight);

                pTexInfo->S3d.RFrameOffset =
                GFX_ULONG_CAST(pTexInfo->Pitch *
                               (pTexInfo->S3d.DisplayModeHeight + pTexInfo->S3d.NumBlankActiveLines));

                if(pTexInfo->Flags.Gpu.Overlay)
                {
                    Height =
                    pTexInfo->S3d.TallBufferHeight =
                    pTexInfo->BaseHeight +
                    pTexInfo->S3d.NumBlankActiveLines +
                    pTexInfo->S3d.DisplayModeHeight;
                }
                else if(pTexInfo->Flags.Gpu.FlipChain)
                {
                    __GMM_ASSERT(pTexInfo->S3d.DisplayModeHeight == pTexInfo->BaseHeight);

                    pTexInfo->S3d.TallBufferHeight =
                    (pTexInfo->BaseHeight * 2) +
                    pTexInfo->S3d.NumBlankActiveLines;
                }
                else
                {
                    // Something must be wrong. Not an S3D resource!
                    __GMM_ASSERT(0);
                }

                __GMM_ASSERT(__GMM_IS_ALIGN(pTexInfo->S3d.RFrameOffset, PAGE_SIZE));
                __GMM_ASSERT(__GMM_IS_ALIGN(pTexInfo->S3d.BlankAreaOffset, PAGE_SIZE));
            }

            // Calculate surface size (physical).
            Size = pTexInfo->Pitch * Height;

            // Calculate tall buffer size (virtual).
            pTexInfo->S3d.TallBufferSize = GFX_ULONG_CAST(pTexInfo->Pitch * pTexInfo->S3d.TallBufferHeight);
        }
        else
        {
            Size = (int64_t)pTexInfo->Pitch * Height;

            if(pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear)
            {
                Size *= pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth;
            }

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (pTexInfo->MSAA.NumSamples > 1) &&
               (pTexInfo->Flags.Gpu.Depth == 0 && pTexInfo->Flags.Gpu.SeparateStencil == 0))
            {
                // For color buffer (meaning not depth or stencil buffer)
                // The width/height for TileYf/Ys MSAA surfaces are not expanded (using GmmExpandWidth/Height functions)
                // because pitch for these surfaces is in their non-expanded dimensions. So, the pitch
                // is also non-expanded units.  That's why, we multiply by the sample size here to get the correct size.
                if(pGmmLibContext->GetSkuTable().FtrTileY)
                {
                    Size *= pTexInfo->MSAA.NumSamples;
                }
                else
                {
                    //XeHP, DG2
                    if (!pGmmLibContext->GetSkuTable().FtrXe2PlusTiling && (pTexInfo->MSAA.NumSamples == 8 || pTexInfo->MSAA.NumSamples == 16))
                    {
                        uint64_t SliceSize = pTexInfo->Pitch * Height;
                        SliceSize *= 4; // multiple by samples per tile
                        Size = (int64_t)SliceSize;
                    }
                    else
                    {
                        Size *= pTexInfo->MSAA.NumSamples;
                    }
                }
            }

            if((pTexInfo->Flags.Info.TiledY && pTexInfo->Flags.Gpu.TiledResource))
            {
                //Pad align surface to 64KB ie Tile size
                Size = GFX_ALIGN(Size, GMM_KBYTE(64));
            }

            if (pGmmLibContext->GetSkuTable().FtrXe2Compression && pTexInfo->Flags.Info.Linear)
            {
                Size = GFX_ALIGN(Size, GMM_BYTES(256)); // for all linear resources starting Xe2, align overall size to compression block size. For subresources, 256B alignment is not needed, needed only for overall resource
                                                        // on older platforms, all linear resources get Halign = 128B which ensures overall size to be a multiple of compression block size of 128B,
                                                        // so this is needed only for linear resources on Xe2 where HAlign continues to be at 128B, but compression block size has doubled to 256B
            }

            // Buffer Sampler Padding...
            if((pTexInfo->Type == RESOURCE_BUFFER) &&
               pGmmLibContext->GetWaTable().WaNoMinimizedTrivialSurfacePadding &&
               !pTexInfo->Flags.Wa.NoBufferSamplerPadding &&
               !pTexInfo->Flags.Info.ExistingSysMem && // <-- Currently using separate padding WA in OCL (and rarity/luck in other UMD's).
               // <-- Never sampled from.
               !pTexInfo->Flags.Gpu.Query &&
               !pTexInfo->Flags.Gpu.HistoryBuffer &&
               !pTexInfo->Flags.Gpu.State &&
               !pTexInfo->Flags.Gpu.StateDx9ConstantBuffer)
            // These can be sampled from, so they need the padding...
            // pTexInfo->Flags.Gpu.Constant
            // pTexInfo->Flags.Gpu.Index
            // pTexInfo->Flags.Gpu.Stream
            // pTexInfo->Flags.Gpu.Vertex

            {
                uint32_t BufferSizeAlignment;
                uint32_t BufferSizePadding;

                // SURFTYPE_BUFFER's that can be sampled from must have their size
                // padded to a multiple of 256 buffer elements and then have an
                // additional 16 bytes of padding beyond that. Currently, the GMM
                // doesn't receive a buffer's element type/size, so (until that's
                // revamped) we'll assume the worst-case of 128-bit elements--which
                // means padding to 256 * 128 / 8 = 4KB and then adding 16 bytes.
                // In the case of BDW:A0, size is padded to a multiple of 512 buffer
                // elements instead of 256--which means padding to 8KB.

                BufferSizeAlignment =
                (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE) ?
                8192 :
                4096;

                BufferSizePadding = 16;

                Size = GFX_ALIGN(Size, BufferSizeAlignment) + BufferSizePadding;
            }

            // HiZ Clear Color requires some small data at the end of the allocation to
            // store the color data.
            if(pTexInfo->Flags.Gpu.HiZ && pTexInfo->Flags.Gpu.IndirectClearColor)
            {
                Size += GMM_HIZ_CLEAR_COLOR_SIZE;
            }

            if(pTexInfo->Flags.Info.ExistingSysMem &&
               !pTexInfo->ExistingSysMem.IsGmmAllocated &&
               !pTexInfo->ExistingSysMem.IsPageAligned)
            {
                // Do not modify Size
            }
            else
            {
                Size = GFX_ALIGN(Size, PAGE_SIZE);
            }
        }

        int64_t SurfaceMaxSize = 0;

        if(pTexInfo->Flags.Gpu.NoRestriction)
        {
            SurfaceMaxSize = pPlatform->NoRestriction.MaxWidth;
        }
        else if(pTexInfo->Flags.Gpu.TiledResource)
        {
            SurfaceMaxSize = GMM_TBYTE(1);
        }
        else
        {
            SurfaceMaxSize = pPlatform->SurfaceMaxSize;
        }

        if(Size <= SurfaceMaxSize)
        {
            pTexInfo->Size = Size;
        }
        else
        {
#if defined(__GMM_KMD__) || defined(__linux__)
            GMM_ASSERTDPF(0, "Surface too large!");
#endif
            Status = GMM_ERROR;
        }
    }

    {
        uint64_t TotalAlignment = (((uint64_t)((uint32_t)(pTexInfo->Alignment.BaseAlignment))) * ((uint32_t)(pBufferType->Alignment)));

        if(!pTexInfo->Alignment.BaseAlignment || __GMM_IS_ALIGN(pBufferType->Alignment, pTexInfo->Alignment.BaseAlignment))
        {
            pTexInfo->Alignment.BaseAlignment = pBufferType->Alignment;
        }
        else if(__GMM_IS_ALIGN(pTexInfo->Alignment.BaseAlignment, pBufferType->Alignment))
        {
            // Do nothing: pTexInfo->Alignment.BaseAlignment is properly alighned
        }
        else if(TotalAlignment > 0xFFFFFFFF)
        {
            GMM_ASSERTDPF(0, "Client requested alignment is too high, failing the allocation to match HW requiremnets. \r\n");
            Status = GMM_ERROR;
        }
        else
        {
            pTexInfo->Alignment.BaseAlignment = pTexInfo->Alignment.BaseAlignment * pBufferType->Alignment;
            GMM_ASSERTDPF(0,
                          "Client requested alignment that is not properly aligned to HW requirements."
                          "Alignment is going to be much higher to match both client and HW requirements.\r\n");
        }
    }

    if((pTexInfo->Flags.Gpu.TilePool && (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE)) ||
       (pTexInfo->Flags.Info.Undefined64KBSwizzle) || GMM_IS_64KB_TILE(pTexInfo->Flags))
    {
        pTexInfo->Alignment.BaseAlignment = (GFX_IS_ALIGNED(pTexInfo->Alignment.BaseAlignment, GMM_KBYTE(64))) ? pTexInfo->Alignment.BaseAlignment : GMM_KBYTE(64);
    }

    if(pGmmLibContext->GetWaTable().WaCompressedResourceRequiresConstVA21 && pTexInfo->Flags.Gpu.MMC)
    {
        pTexInfo->Alignment.BaseAlignment = GMM_MBYTE(4);
    }

    GMM_DPF_EXIT;

    return (Status);
}